

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

QMimeData * __thiscall
QPlainTextEditControl::createMimeDataFromSelection(QPlainTextEditControl *this)

{
  QPlainTextEdit *pQVar1;
  QMimeData *pQVar2;
  
  pQVar1 = QtPrivate::qobject_cast_helper<QPlainTextEdit*,QObject>
                     (*(QObject **)(*(long *)&(this->super_QWidgetTextControl).field_0x8 + 0x10));
  if (pQVar1 != (QPlainTextEdit *)0x0) {
    pQVar2 = (QMimeData *)
             (**(code **)(*(long *)&(pQVar1->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                         0x1d0))(pQVar1);
    return pQVar2;
  }
  pQVar2 = QWidgetTextControl::createMimeDataFromSelection((QWidgetTextControl *)this);
  return pQVar2;
}

Assistant:

QMimeData *QPlainTextEditControl::createMimeDataFromSelection() const {
        QPlainTextEdit *ed = qobject_cast<QPlainTextEdit *>(parent());
        if (!ed)
            return QWidgetTextControl::createMimeDataFromSelection();
        return ed->createMimeDataFromSelection();
    }